

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpat.h
# Opt level: O3

void __thiscall CVmObjPattern::mark_refs(CVmObjPattern *this,uint state)

{
  char *pcVar1;
  
  pcVar1 = (this->super_CVmObject).ext_;
  if (((pcVar1 != (char *)0x0) && (*(int *)(pcVar1 + 8) == 5)) &&
     (*(vm_obj_id_t *)(pcVar1 + 0x10) != 0)) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,*(vm_obj_id_t *)(pcVar1 + 0x10),state);
    return;
  }
  return;
}

Assistant:

vmobj_pat_ext *get_ext() const { return (vmobj_pat_ext *)ext_; }